

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

bool flatbuffers::java::SaveClass(Parser *parser,Definition *def,string *classcode,string *path)

{
  bool bVar1;
  long lVar2;
  reference pbVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator local_b1;
  undefined1 local_b0 [8];
  string code;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  const_iterator it;
  undefined1 local_70 [8];
  string name_space_dir;
  string name_space_java;
  string *path_local;
  string *classcode_local;
  Definition *def_local;
  Parser *parser_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    parser_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string((string *)(name_space_dir.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_70,(string *)path);
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&parser->name_space_);
    while( true ) {
      code.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&parser->name_space_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_88,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&code.field_2 + 8));
      if (!bVar1) break;
      lVar2 = std::__cxx11::string::length();
      if (lVar2 != 0) {
        std::__cxx11::string::operator+=((string *)(name_space_dir.field_2._M_local_buf + 8),".");
        std::__cxx11::string::operator+=((string *)local_70,"/");
      }
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_88);
      std::__cxx11::string::operator+=
                ((string *)(name_space_dir.field_2._M_local_buf + 8),(string *)pbVar3);
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_88);
      std::__cxx11::string::operator+=((string *)local_70,(string *)pbVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      mkdir(pcVar4,0x1ed);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_88);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_b0,"// automatically generated, do not modify\n\n",&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8),"package ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name_space_dir.field_2 + 8));
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8),";\n\n");
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)local_b0,"import java.nio.*;\nimport java.lang.*;\nimport java.util.*;\n");
    std::__cxx11::string::operator+=((string *)local_b0,"import flatbuffers.*;\n\n");
    std::__cxx11::string::operator+=((string *)local_b0,(string *)classcode);
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"/"
                  );
    std::operator+(&local_138,&local_158,&def->name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   &local_138,".java");
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    parser_local._7_1_ = SaveFile(pcVar4,(string *)local_b0,false);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(name_space_dir.field_2._M_local_buf + 8));
  }
  return parser_local._7_1_;
}

Assistant:

static bool SaveClass(const Parser &parser, const Definition &def,
                      const std::string &classcode, const std::string &path) {
  if (!classcode.length()) return true;

  std::string name_space_java;
  std::string name_space_dir = path;
  for (auto it = parser.name_space_.begin();
        it != parser.name_space_.end(); ++it) {
    if (name_space_java.length()) {
      name_space_java += ".";
      name_space_dir += PATH_SEPARATOR;
    }
    name_space_java += *it;
    name_space_dir += *it;
    mkdir(name_space_dir.c_str(), S_IRWXU|S_IRGRP|S_IXGRP|S_IROTH|S_IXOTH);
  }

  std::string code = "// automatically generated, do not modify\n\n";
  code += "package " + name_space_java + ";\n\n";
  code += "import java.nio.*;\nimport java.lang.*;\nimport java.util.*;\n";
  code += "import flatbuffers.*;\n\n";
  code += classcode;
  auto filename = name_space_dir + PATH_SEPARATOR + def.name + ".java";
  return SaveFile(filename.c_str(), code, false);
}